

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O2

int __thiscall cinatra::coro_http_server::listen(coro_http_server *this,int __fd,int __n)

{
  acceptor *this_00;
  undefined4 *puVar1;
  long lVar2;
  undefined8 uVar3;
  error_category *peVar4;
  socklen_t __len;
  long lVar5;
  int iVar6;
  cerr_logger_t *this_01;
  uint16_t *t;
  cerr_logger_t local_1b9;
  error_code ec;
  error_code ignore_ec;
  long local_198;
  endpoint_type end_point;
  endpoint_type endpoint;
  iterator it_end;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  long local_f8;
  resolver resolver;
  query query;
  
  ec._M_value = 0;
  peVar4 = (error_category *)std::_V2::system_category();
  ec._M_cat = peVar4;
  std::__cxx11::to_string((string *)&resolver,(uint)this->port_);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&query,&this->address_,(string *)&resolver,address_configured);
  std::__cxx11::string::~string((string *)&resolver);
  asio::execution::
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  ::any_executor((any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                  *)&ignore_ec,
                 &(this->acceptor_).impl_.executor_.
                  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                );
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver
            (&resolver,(executor_type *)&ignore_ec);
  asio::execution::detail::any_executor_base::~any_executor_base((any_executor_base *)&ignore_ec);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&ignore_ec,&resolver,&query,&ec);
  _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ignore_ec._M_cat;
  uVar3 = ignore_ec._0_8_;
  ignore_ec._M_cat = (error_category *)0x0;
  ignore_ec._M_value = 0;
  ignore_ec._4_4_ = 0;
  local_f8 = local_198;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ignore_ec._M_cat);
  it_end.index_ = 0;
  it_end.values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  it_end.values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((ec._M_value != 0) || (uVar3 == 0)) {
    std::operator<<((ostream *)&std::cerr,"bad address: ");
    std::operator<<((ostream *)&std::cerr,(string *)&this->address_);
    std::operator<<((ostream *)&std::cerr," error: ");
    (**(code **)(*(long *)ec._M_cat + 0x20))(&ignore_ec,ec._M_cat,ec._M_value);
    std::operator<<((ostream *)&std::cerr,(string *)&ignore_ec);
    std::__cxx11::string::~string((string *)&ignore_ec);
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)&endpoint);
    iVar6 = ec._M_value;
    if (ec._M_value == 0) {
      std::_V2::generic_category();
      iVar6 = 99;
    }
    goto LAB_0011e957;
  }
  this_00 = &this->acceptor_;
  lVar5 = local_f8 * 0x60;
  lVar2 = *(long *)uVar3;
  puVar1 = (undefined4 *)(lVar2 + lVar5);
  endpoint.impl_.data_._0_4_ = *puVar1;
  endpoint.impl_.data_.v4.sin_addr.s_addr = (in_addr)puVar1[1];
  endpoint.impl_.data_._8_4_ = puVar1[2];
  endpoint.impl_.data_._12_4_ = puVar1[3];
  lVar2 = lVar2 + 0xc + lVar5;
  endpoint.impl_.data_._16_4_ = *(undefined4 *)(lVar2 + 4);
  endpoint.impl_.data_._20_4_ = *(undefined4 *)(lVar2 + 8);
  endpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar2 + 0xc);
  ignore_ec._M_value = (uint)(endpoint.impl_.data_.base.sa_family != 2) * 8 + 2;
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::open
            (this_00,(char *)&ignore_ec,(int)&ec);
  __len = (socklen_t)lVar5;
  if (ec._M_value == 0) {
    ignore_ec._M_value = 1;
    asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)this_00,
               (boolean<1,_2> *)&ignore_ec,&ec);
    asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::bind
              (this_00,(int)&endpoint,(sockaddr *)&ec,__len);
    t = &this->port_;
    if (ec._M_value != 0) {
      std::operator<<((ostream *)&std::cerr,"bind port: ");
      cerr_logger_t::operator<<((cerr_logger_t *)&end_point,t);
      std::operator<<((ostream *)&std::cerr," error: ");
      (**(code **)(*(long *)ec._M_cat + 0x20))(&ignore_ec,ec._M_cat,ec._M_value);
      std::operator<<((ostream *)&std::cerr,(string *)&ignore_ec);
      std::__cxx11::string::~string((string *)&ignore_ec);
      cerr_logger_t::~cerr_logger_t((cerr_logger_t *)&end_point);
      ignore_ec._M_value = 0;
      ignore_ec._M_cat = peVar4;
      asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::cancel(this_00,&ignore_ec);
      asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::close
                (this_00,(int)&ignore_ec);
      iVar6 = ec._M_value;
      goto LAB_0011e957;
    }
    asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::listen
              (this_00,0x1000,(int)&ec);
    if (ec._M_value != 0) {
      std::operator<<((ostream *)&std::cerr,"get local endpoint port: ");
      cerr_logger_t::operator<<((cerr_logger_t *)&end_point,t);
      std::operator<<((ostream *)&std::cerr," listen error: ");
      (**(code **)(*(long *)ec._M_cat + 0x20))(&ignore_ec,ec._M_cat,ec._M_value);
      std::operator<<((ostream *)&std::cerr,(string *)&ignore_ec);
      goto LAB_0011e868;
    }
    asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::local_endpoint
              (&end_point,this_00,&ec);
    if (ec._M_value == 0) {
      *t = end_point.impl_.data_.v4.sin_port << 8 | end_point.impl_.data_.v4.sin_port >> 8;
      iVar6 = 0;
      goto LAB_0011e957;
    }
    std::operator<<((ostream *)&std::cerr,"get local endpoint port: ");
    cerr_logger_t::operator<<(&local_1b9,t);
    std::operator<<((ostream *)&std::cerr," error: ");
    (**(code **)(*(long *)ec._M_cat + 0x20))(&ignore_ec,ec._M_cat,ec._M_value);
    std::operator<<((ostream *)&std::cerr,(string *)&ignore_ec);
    std::__cxx11::string::~string((string *)&ignore_ec);
    this_01 = &local_1b9;
  }
  else {
    std::operator<<((ostream *)&std::cerr,"acceptor open failed");
    std::operator<<((ostream *)&std::cerr," error: ");
    (**(code **)(*(long *)ec._M_cat + 0x20))(&ignore_ec,ec._M_cat,ec._M_value);
    std::operator<<((ostream *)&std::cerr,(string *)&ignore_ec);
LAB_0011e868:
    std::__cxx11::string::~string((string *)&ignore_ec);
    this_01 = (cerr_logger_t *)&end_point;
  }
  cerr_logger_t::~cerr_logger_t(this_01);
  iVar6 = ec._M_value;
LAB_0011e957:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&it_end.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_100);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&resolver.impl_);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&query);
  return iVar6;
}

Assistant:

std::error_code listen() {
    CINATRA_LOG_INFO << "begin to listen " << port_;
    using asio::ip::tcp;
    asio::error_code ec;

    asio::ip::tcp::resolver::query query(address_, std::to_string(port_));
    asio::ip::tcp::resolver resolver(acceptor_.get_executor());
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);

    asio::ip::tcp::resolver::iterator it_end;
    if (ec || it == it_end) {
      CINATRA_LOG_ERROR << "bad address: " << address_
                        << " error: " << ec.message();
      if (ec) {
        return ec;
      }
      return std::make_error_code(std::errc::address_not_available);
    }

    auto endpoint = it->endpoint();
    acceptor_.open(endpoint.protocol(), ec);
    if (ec) {
      CINATRA_LOG_ERROR << "acceptor open failed"
                        << " error: " << ec.message();
      return ec;
    }
#ifdef __GNUC__
    acceptor_.set_option(tcp::acceptor::reuse_address(true), ec);
#endif
    acceptor_.bind(endpoint, ec);
    if (ec) {
      CINATRA_LOG_ERROR << "bind port: " << port_ << " error: " << ec.message();
      std::error_code ignore_ec;
      acceptor_.cancel(ignore_ec);
      acceptor_.close(ignore_ec);
      return ec;
    }
#ifdef _MSC_VER
    acceptor_.set_option(tcp::acceptor::reuse_address(true));
#endif
    acceptor_.listen(asio::socket_base::max_listen_connections, ec);
    if (ec) {
      CINATRA_LOG_ERROR << "get local endpoint port: " << port_
                        << " listen error: " << ec.message();
      return ec;
    }

    auto end_point = acceptor_.local_endpoint(ec);
    if (ec) {
      CINATRA_LOG_ERROR << "get local endpoint port: " << port_
                        << " error: " << ec.message();
      return ec;
    }
    port_ = end_point.port();

    CINATRA_LOG_INFO << "listen port " << port_ << " successfully";
    return {};
  }